

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O1

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceLoopIterator
          (string *__return_storage_ptr__,SQLLogicTestRunner *this,string *text,
          string *loop_iterator_name,string *replacement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SourceLineInfo *pSVar2;
  pointer pcVar3;
  undefined8 uVar4;
  char cVar5;
  long *plVar6;
  reference pvVar7;
  long *plVar8;
  size_type *psVar9;
  string *psVar10;
  size_type __n;
  AssertionHandler catchAssertionHandler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  name_splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  replacement_splits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  AssertionHandler local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  ReusableStringStream local_f8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  StringRef local_40;
  
  pcVar3 = (replacement->_M_dataplus)._M_p;
  local_138 = __return_storage_ptr__;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + replacement->_M_string_length);
  ReplaceKeywords((string *)&local_198,this,&local_60);
  std::__cxx11::string::operator=((string *)replacement,(string *)&local_198);
  if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start !=
      &local_198.m_assertionInfo.lineInfo) {
    operator_delete(local_198.m_assertionInfo.macroName.m_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pSVar2 = &local_198.m_assertionInfo.lineInfo;
  local_198.m_assertionInfo.macroName.m_start = (char *)pSVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,",","");
  cVar5 = duckdb::StringUtil::Contains((string *)loop_iterator_name,(string *)&local_198);
  if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start != pSVar2) {
    operator_delete(local_198.m_assertionInfo.macroName.m_start);
  }
  if (cVar5 == '\0') {
    pcVar3 = (text->_M_dataplus)._M_p;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar3,pcVar3 + text->_M_string_length);
    std::operator+(&local_1d8,"${",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   loop_iterator_name);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar10 = local_138;
    plVar8 = plVar6 + 2;
    if ((SourceLineInfo *)*plVar6 == (SourceLineInfo *)plVar8) {
      local_198.m_assertionInfo.lineInfo.file = (char *)*plVar8;
      local_198.m_assertionInfo.lineInfo.line._0_4_ = (undefined4)plVar6[3];
      local_198.m_assertionInfo.lineInfo.line._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
      local_198.m_assertionInfo.macroName.m_start = (char *)pSVar2;
    }
    else {
      local_198.m_assertionInfo.lineInfo.file = (char *)*plVar8;
      local_198.m_assertionInfo.macroName.m_start = (char *)*plVar6;
    }
    local_198.m_assertionInfo.macroName.m_size = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    duckdb::StringUtil::Replace(local_138,local_a0,&local_198,replacement);
    if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start != pSVar2) {
      operator_delete(local_198.m_assertionInfo.macroName.m_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0]);
    }
  }
  else {
    local_198.m_assertionInfo.macroName.m_start = (char *)pSVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,",","");
    duckdb::StringUtil::Split((string *)&local_150,(string *)loop_iterator_name);
    if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start != pSVar2) {
      operator_delete(local_198.m_assertionInfo.macroName.m_start);
    }
    local_198.m_assertionInfo.macroName.m_start = (char *)pSVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,",","");
    duckdb::StringUtil::Split((string *)&local_130,(string *)replacement);
    if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start != pSVar2) {
      operator_delete(local_198.m_assertionInfo.macroName.m_start);
    }
    if ((long)local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_150.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)local_130.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_130.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      local_1d8._M_dataplus._M_p = "FAIL";
      local_1d8._M_string_length = 4;
      local_1b8._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sqlite/sqllogic_test_runner.cpp"
      ;
      local_1b8._M_string_length = 0x93;
      Catch::AssertionHandler::AssertionHandler
                (&local_198,(StringRef *)&local_1d8,(SourceLineInfo *)&local_1b8,
                 (StringRef)ZEXT816(0x504515),Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      std::operator+(&local_80,"foreach loop: number of commas in loop iterator (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     loop_iterator_name);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_d0 = *plVar8;
        lStack_c8 = plVar6[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar8;
        local_e0 = (long *)*plVar6;
      }
      local_d8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e0,(ulong)(replacement->_M_dataplus)._M_p);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_b0 = *plVar8;
        lStack_a8 = plVar6[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar8;
        local_c0 = (long *)*plVar6;
      }
      local_b8 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_1b8.field_2._M_allocated_capacity = *psVar9;
        local_1b8.field_2._8_8_ = plVar6[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar9;
        local_1b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1b8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f8.m_oss,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_1d8,&local_f8);
      local_40.m_start = local_1d8._M_dataplus._M_p;
      local_40.m_size = local_1d8._M_string_length;
      Catch::AssertionHandler::handleMessage(&local_198,ExplicitFailure,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&local_198);
      if (local_198.m_completed == false) {
        (*(local_198.m_resultCapture)->_vptr_IResultCapture[0x11])();
      }
    }
    if (local_150.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_150.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        local_118[0] = local_108;
        pcVar3 = (text->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar3,pcVar3 + text->_M_string_length);
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_150,__n);
        std::operator+(&local_1b8,"${",pvVar7);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1d8.field_2._M_allocated_capacity = *psVar9;
          local_1d8.field_2._8_8_ = plVar6[3];
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        }
        else {
          local_1d8.field_2._M_allocated_capacity = *psVar9;
          local_1d8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_1d8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&local_130,__n);
        duckdb::StringUtil::Replace(&local_198,(string *)local_118,&local_1d8,pvVar7);
        std::__cxx11::string::operator=((string *)text,(string *)&local_198);
        if ((SourceLineInfo *)local_198.m_assertionInfo.macroName.m_start !=
            &local_198.m_assertionInfo.lineInfo) {
          operator_delete(local_198.m_assertionInfo.macroName.m_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (local_118[0] != local_108) {
          operator_delete(local_118[0]);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)local_150.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_150.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    psVar10 = local_138;
    (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
    pcVar3 = (text->_M_dataplus)._M_p;
    paVar1 = &text->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&text->field_2 + 8);
      (local_138->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_138->field_2 + 8) = uVar4;
    }
    else {
      (local_138->_M_dataplus)._M_p = pcVar3;
      (local_138->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_138->_M_string_length = text->_M_string_length;
    (text->_M_dataplus)._M_p = (pointer)paVar1;
    text->_M_string_length = 0;
    (text->field_2)._M_local_buf[0] = '\0';
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_150);
  }
  return psVar10;
}

Assistant:

string SQLLogicTestRunner::ReplaceLoopIterator(string text, string loop_iterator_name, string replacement) {
	replacement = ReplaceKeywords(replacement);
	if (StringUtil::Contains(loop_iterator_name, ",")) {
		auto name_splits = StringUtil::Split(loop_iterator_name, ",");
		auto replacement_splits = StringUtil::Split(replacement, ",");
		if (name_splits.size() != replacement_splits.size()) {
			FAIL("foreach loop: number of commas in loop iterator (" + loop_iterator_name +
			     ") does not match number of commas in replacement (" + replacement + ")");
		}
		for (idx_t i = 0; i < name_splits.size(); i++) {
			text = StringUtil::Replace(text, "${" + name_splits[i] + "}", replacement_splits[i]);
		}
		return text;
	} else {
		return StringUtil::Replace(text, "${" + loop_iterator_name + "}", replacement);
	}
}